

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O2

u32 duckdb_fsst_import(duckdb_fsst_decoder_t *decoder,u8 *buf)

{
  byte bVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  u32 i;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  undefined8 local_38;
  u8 lenHisto [8];
  
  uVar3 = 0;
  if (*(int *)(buf + 4) == 0x134140a) {
    bVar1 = buf[8];
    uVar4 = bVar1 & 1;
    decoder->zeroTerminated = (uchar)uVar4;
    uVar2 = *(undefined8 *)(buf + 9);
    local_38 = uVar2;
    decoder->len[0] = '\x01';
    decoder->symbol[0] = 0;
    if ((bVar1 & 1) != 0) {
      local_38 = CONCAT71((int7)((ulong)uVar2 >> 8),(char)uVar2 + -1);
    }
    uVar3 = 0x11;
    for (uVar7 = 1; uVar7 != 9; uVar7 = uVar7 + 1) {
      bVar1 = *(byte *)((long)&local_38 + (ulong)(uVar7 & 7));
      bVar8 = (char)(uVar7 & 7) + 1;
      for (uVar6 = 0; uVar6 != bVar1; uVar6 = uVar6 + 1) {
        uVar5 = (ulong)uVar4;
        decoder->len[uVar5] = bVar8;
        decoder->symbol[uVar5] = 0;
        for (uVar9 = 0; uVar9 < bVar8; uVar9 = uVar9 + 1) {
          *(u8 *)((long)decoder->symbol + uVar9 + uVar5 * 8) = buf[uVar3 + uVar9 & 0xffffffff];
        }
        uVar4 = uVar4 + 1;
        uVar3 = uVar3 + (int)uVar9;
      }
    }
    for (uVar5 = (ulong)uVar4; uVar5 < 0xff; uVar5 = uVar5 + 1) {
      decoder->symbol[uVar5] = 0x74707572726f63;
      decoder->len[uVar5] = '\b';
    }
  }
  return uVar3;
}

Assistant:

u32 duckdb_fsst_import(duckdb_fsst_decoder_t *decoder, u8 *buf) {
	u64 version = 0;
	u32 code, pos = 17;
	u8 lenHisto[8];

	// version field (first 8 bytes) is now there just for future-proofness, unused still (skipped)
	memcpy(&version, buf, 8);
	if ((version>>32) != FSST_VERSION) return 0;
	decoder->zeroTerminated = buf[8]&1;
	memcpy(lenHisto, buf+9, 8);

	// in case of zero-terminated, first symbol is "" (zero always, may be overwritten)
	decoder->len[0] = 1;
	decoder->symbol[0] = 0;

	// we use lenHisto[0] as 1-byte symbol run length (at the end)
	code = decoder->zeroTerminated;
	if (decoder->zeroTerminated) lenHisto[0]--; // if zeroTerminated, then symbol "" aka 1-byte code=0, is not stored at the end

	// now get all symbols from the buffer
	for(u32 l=1; l<=8; l++) { /* l = 1,2,3,4,5,6,7,8 */
		for(u32 i=0; i < lenHisto[(l&7) /* 1,2,3,4,5,6,7,0 */]; i++, code++)  {
			decoder->len[code] = (l&7)+1; /* len = 2,3,4,5,6,7,8,1  */
			decoder->symbol[code] = 0;
			for(u32 j=0; j<decoder->len[code]; j++)
				((u8*) &decoder->symbol[code])[j] = buf[pos++]; // note this enforces 'little endian' symbols
		}
	}
	if (decoder->zeroTerminated) lenHisto[0]++;

	// fill unused symbols with text "corrupt". Gives a chance to detect corrupted code sequences (if there are unused symbols).
	while(code<255) {
		decoder->symbol[code] = FSST_CORRUPT;
		decoder->len[code++] = 8;
	}
	return pos;
}